

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O0

void keccak_output(keccak_state *s,void *voutput)

{
  undefined1 local_110 [8];
  uchar outbytes [8];
  size_t to_copy;
  uint x;
  uint y;
  size_t n;
  size_t len;
  uchar padding [200];
  uchar *output;
  void *voutput_local;
  keccak_state *s_local;
  
  n = s->bytes_wanted - s->bytes_got;
  if (n == 0) {
    n = s->bytes_wanted;
  }
  padding._192_8_ = voutput;
  memset(&len,0,n);
  len._0_1_ = (byte)len | s->first_pad_byte;
  *(byte *)((long)&n + n + 7) = *(byte *)((long)&n + n + 7) | 0x80;
  keccak_accumulate(s,&len,n);
  _x = 0;
  for (to_copy._4_4_ = 0; to_copy._4_4_ < 5; to_copy._4_4_ = to_copy._4_4_ + 1) {
    to_copy._0_4_ = 0;
    for (; ((uint)to_copy < 5 &&
           (outbytes = (uchar  [8])(s->hash_bytes - _x), outbytes != (uchar  [8])0x0));
        _x = (long)outbytes + _x) {
      if (8 < (ulong)outbytes) {
        outbytes[0] = '\b';
        outbytes[1] = '\0';
        outbytes[2] = '\0';
        outbytes[3] = '\0';
        outbytes[4] = '\0';
        outbytes[5] = '\0';
        outbytes[6] = '\0';
        outbytes[7] = '\0';
      }
      PUT_64BIT_LSB_FIRST(local_110,s->A[(uint)to_copy][to_copy._4_4_]);
      memcpy((void *)(padding._192_8_ + _x),local_110,(size_t)outbytes);
      to_copy._0_4_ = (uint)to_copy + 1;
    }
  }
  return;
}

Assistant:

static void keccak_output(keccak_state *s, void *voutput)
{
    unsigned char *output = (unsigned char *)voutput;

    /*
     * Add message padding.
     */
    {
        unsigned char padding[25*8];
        size_t len = s->bytes_wanted - s->bytes_got;
        if (len == 0)
            len = s->bytes_wanted;
        memset(padding, 0, len);
        padding[0] |= s->first_pad_byte;
        padding[len-1] |= 0x80;
        keccak_accumulate(s, padding, len);
    }

    size_t n = 0;
    for (unsigned y = 0; y < 5; y++) {
        for (unsigned x = 0; x < 5; x++) {
            size_t to_copy = s->hash_bytes - n;
            if (to_copy == 0)
                break;
            if (to_copy > 8)
                to_copy = 8;
            unsigned char outbytes[8];
            PUT_64BIT_LSB_FIRST(outbytes, s->A[x][y]);
            memcpy(output + n, outbytes, to_copy);
            n += to_copy;
        }
    }
}